

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::IsAttributeSet
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,uint32 index,PropertyAttributes attr)

{
  bool bVar1;
  byte bVar2;
  IndexPropertyDescriptorMap *this_00;
  IndexPropertyDescriptor *local_28;
  IndexPropertyDescriptor *descriptor;
  PropertyAttributes attr_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEStack_18;
  uint32 index_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  descriptor._3_1_ = attr;
  descriptor._4_4_ = index;
  pEStack_18 = this;
  this_00 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                      (&this->indexPropertyMap);
  bVar1 = IndexPropertyDescriptorMap::TryGetReference(this_00,descriptor._4_4_,&local_28);
  if (bVar1) {
    if ((local_28->Attributes & 8) == 0) {
      this_local._4_4_ = (uint)(local_28->Attributes & descriptor._3_1_);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    bVar2 = GetDataItemAttributes(this);
    this_local._4_4_ = (uint)(bVar2 & descriptor._3_1_);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsAttributeSet(uint32 index, PropertyAttributes attr)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (!(descriptor->Attributes & PropertyDeleted))
            {
                return descriptor->Attributes & attr;
            }
        }
        else
        {
            return GetDataItemAttributes() & attr;
        }

        return true;
    }